

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalInitExpr_GlobalGet
          (SharedValidator *this,Location *loc,Var *ref_global_var)

{
  bool bVar1;
  Result RVar2;
  char *pcVar3;
  reference pvVar4;
  int __c;
  Var *global_var;
  Var local_80;
  Enum local_38;
  GlobalType local_34;
  GlobalType ref_global;
  Result result;
  Var *ref_global_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  
  unique0x100001a9 = ref_global_var;
  Result::Result((Result *)&ref_global,Ok);
  GlobalType::GlobalType(&local_34);
  Var::Var(&local_80,ref_global_var);
  global_var = &local_80;
  local_38 = (Enum)CheckGlobalIndex(this,global_var,&local_34);
  bVar1 = Failed((Result)local_38);
  Var::~Var(&local_80);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    pcVar3 = Var::index(ref_global_var,(char *)global_var,__c);
    if (this->num_imported_globals_ <= (uint)pcVar3) {
      RVar2 = PrintError(this,&ref_global_var->loc,
                         "initializer expression can only reference an imported global");
      Result::operator|=((Result *)&ref_global,RVar2);
    }
    if ((local_34.mutable_ & 1U) != 0) {
      RVar2 = PrintError(this,loc,"initializer expression cannot reference a mutable global");
      Result::operator|=((Result *)&ref_global,RVar2);
    }
    pvVar4 = std::
             vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
             ::back(&this->globals_);
    RVar2 = CheckType(this,loc,local_34.type,(Type)(pvVar4->type).enum_,
                      "global initializer expression");
    Result::operator|=((Result *)&ref_global,RVar2);
    this_local._4_4_ = ref_global.type.enum_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobalInitExpr_GlobalGet(const Location& loc,
                                                   Var ref_global_var) {
  Result result = Result::Ok;
  GlobalType ref_global;
  CHECK_RESULT(CheckGlobalIndex(ref_global_var, &ref_global));

  if (ref_global_var.index() >= num_imported_globals_) {
    result |= PrintError(
        ref_global_var.loc,
        "initializer expression can only reference an imported global");
  }

  if (ref_global.mutable_) {
    result |= PrintError(
        loc, "initializer expression cannot reference a mutable global");
  }

  result |= CheckType(loc, ref_global.type, globals_.back().type,
                      "global initializer expression");
  return result;
}